

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O1

Reals __thiscall Omega_h::resize_vectors(Omega_h *this,Reals *old_vectors,Int old_dim,Int new_dim)

{
  int *piVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined4 in_register_00000014;
  long lVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  Alloc *pAVar7;
  int iVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  void *pvVar12;
  Alloc *this_00;
  void *pvVar13;
  Reals RVar14;
  IntIterator last;
  Write<double> new_vectors;
  type f;
  Write<double> local_c8;
  string local_b0;
  Alloc *local_90;
  void *local_88;
  Int local_80;
  Alloc *local_78;
  void *local_70;
  Write<double> local_68;
  Alloc *local_58;
  Alloc *local_50;
  long local_48;
  long local_40;
  size_t local_38;
  
  pvVar13 = (void *)CONCAT44(in_register_00000014,old_dim);
  pAVar7 = (old_vectors->write_).shared_alloc_.alloc;
  if (old_dim == new_dim) {
    *(Alloc **)this = pAVar7;
    *(void **)(this + 8) = (old_vectors->write_).shared_alloc_.direct_ptr;
    if ((((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar7->use_count = pAVar7->use_count + -1;
      *(size_t *)this = pAVar7->size * 8 + 1;
    }
    (old_vectors->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (old_vectors->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    if (((ulong)pAVar7 & 1) == 0) {
      sVar9 = pAVar7->size;
    }
    else {
      sVar9 = (ulong)pAVar7 >> 3;
    }
    iVar3 = divide_no_remainder<int>((int)(sVar9 >> 3),old_dim);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    Write<double>::Write(&local_c8,iVar3 * new_dim,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    uVar11 = (ulong)(uint)old_dim;
    if (new_dim < old_dim) {
      uVar11 = (ulong)(uint)new_dim;
    }
    uVar10 = (uint)uVar11;
    local_b0._M_dataplus._M_p._0_4_ = uVar10;
    local_b0._M_string_length = (size_type)local_c8.shared_alloc_.alloc;
    if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
        local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0._M_string_length = (local_c8.shared_alloc_.alloc)->size * 8 + 1;
      }
      else {
        (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b0.field_2._M_allocated_capacity = (size_type)local_c8.shared_alloc_.direct_ptr;
    local_90 = (old_vectors->write_).shared_alloc_.alloc;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90 = (Alloc *)(local_90->size * 8 + 1);
      }
      else {
        local_90->use_count = local_90->use_count + 1;
      }
    }
    pvVar13 = (old_vectors->write_).shared_alloc_.direct_ptr;
    pAVar7 = (Alloc *)local_b0._M_string_length;
    if ((local_b0._M_string_length & 7) == 0 && (Alloc *)local_b0._M_string_length != (Alloc *)0x0)
    {
      if (entering_parallel == '\x01') {
        pAVar7 = (Alloc *)(*(size_t *)local_b0._M_string_length * 8 + 1);
      }
      else {
        *(int *)(local_b0._M_string_length + 0x30) = *(int *)(local_b0._M_string_length + 0x30) + 1;
      }
    }
    this_00 = local_90;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        this_00 = (Alloc *)(local_90->size * 8 + 1);
      }
      else {
        local_90->use_count = local_90->use_count + 1;
      }
    }
    local_b0.field_2._8_4_ = new_dim;
    local_88 = pvVar13;
    local_80 = old_dim;
    if (0 < iVar3) {
      local_70 = local_c8.shared_alloc_.direct_ptr;
      if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
        pAVar7->use_count = pAVar7->use_count + -1;
        pAVar7 = (Alloc *)(pAVar7->size * 8 + 1);
      }
      local_78 = this_00;
      if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
        this_00->use_count = this_00->use_count + -1;
        local_78 = (Alloc *)(this_00->size * 8 + 1);
      }
      entering_parallel = '\0';
      local_38 = (ulong)(~uVar10 + new_dim) * 8 + 8;
      lVar5 = (long)new_dim << 3;
      lVar6 = (long)old_dim << 3;
      iVar8 = 0;
      pvVar12 = local_c8.shared_alloc_.direct_ptr;
      local_58 = pAVar7;
      local_50 = (Alloc *)this;
      local_48 = lVar6;
      local_40 = lVar5;
      do {
        if (0 < (int)uVar10) {
          uVar4 = 0;
          do {
            *(undefined8 *)((long)pvVar12 + uVar4 * 8) = *(undefined8 *)((long)pvVar13 + uVar4 * 8);
            uVar4 = uVar4 + 1;
          } while (uVar11 != uVar4);
        }
        if (old_dim < new_dim) {
          memset((void *)((long)local_70 + (long)(int)(iVar8 * new_dim + uVar10) * 8),0,local_38);
          lVar5 = local_40;
          lVar6 = local_48;
        }
        pAVar7 = local_78;
        iVar8 = iVar8 + 1;
        pvVar12 = (void *)((long)pvVar12 + lVar5);
        pvVar13 = (void *)((long)pvVar13 + lVar6);
      } while (iVar3 != iVar8);
      if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
        piVar1 = &local_78->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_78);
          operator_delete(pAVar7,0x48);
        }
      }
      this = (Omega_h *)local_50;
      pAVar7 = local_58;
      if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
        piVar1 = &local_58->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_58);
          operator_delete(pAVar7,0x48);
        }
      }
      this_00 = (Alloc *)0x0;
      pAVar7 = (Alloc *)0x0;
    }
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar1 = &this_00->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
      piVar1 = &pAVar7->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    local_68.shared_alloc_.alloc = local_c8.shared_alloc_.alloc;
    local_68.shared_alloc_.direct_ptr = local_c8.shared_alloc_.direct_ptr;
    if ((((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
         local_c8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + -1;
      local_68.shared_alloc_.alloc = (Alloc *)((local_c8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_c8.shared_alloc_.alloc = (Alloc *)0x0;
    local_c8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_68);
    pAVar7 = local_68.shared_alloc_.alloc;
    pvVar13 = extraout_RDX;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.shared_alloc_.alloc);
        operator_delete(pAVar7,0x48);
        pvVar13 = extraout_RDX_00;
      }
    }
    pAVar7 = local_90;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      piVar1 = &local_90->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_90);
        operator_delete(pAVar7,0x48);
        pvVar13 = extraout_RDX_01;
      }
    }
    sVar2 = local_b0._M_string_length;
    if ((local_b0._M_string_length & 7) == 0 && (Alloc *)local_b0._M_string_length != (Alloc *)0x0)
    {
      piVar1 = (int *)(local_b0._M_string_length + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_b0._M_string_length);
        operator_delete((void *)sVar2,0x48);
        pvVar13 = extraout_RDX_02;
      }
    }
    pAVar7 = local_c8.shared_alloc_.alloc;
    if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
        local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c8.shared_alloc_.alloc);
        operator_delete(pAVar7,0x48);
        pvVar13 = extraout_RDX_03;
      }
    }
  }
  RVar14.write_.shared_alloc_.direct_ptr = pvVar13;
  RVar14.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar14.write_.shared_alloc_;
}

Assistant:

Reals resize_vectors(Reals old_vectors, Int old_dim, Int new_dim) {
  if (old_dim == new_dim) return old_vectors;
  auto nv = divide_no_remainder(old_vectors.size(), old_dim);
  Write<Real> new_vectors(nv * new_dim);
  auto min_dim = min2(old_dim, new_dim);
  auto f = OMEGA_H_LAMBDA(Int i) {
    for (Int j = 0; j < min_dim; ++j) {
      new_vectors[i * new_dim + j] = old_vectors[i * old_dim + j];
    }
    for (Int j = min_dim; j < new_dim; ++j) {
      new_vectors[i * new_dim + j] = 0.0;
    }
  };
  parallel_for(nv, f, "resize_vectors");
  return new_vectors;
}